

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O0

apx_error_t
apx_vm_deserializer_unpack_int32
          (apx_vm_deserializer_t *self,uint32_t array_length,apx_sizeType_t dynamic_size_type)

{
  apx_error_t result;
  apx_sizeType_t dynamic_size_type_local;
  uint32_t array_length_local;
  apx_vm_deserializer_t *self_local;
  
  if (self == (apx_vm_deserializer_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    if (self->state == (apx_vm_readState_t *)0x0) {
      __assert_fail("self->state != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/deserializer.c"
                    ,0x13c,
                    "apx_error_t apx_vm_deserializer_unpack_int32(apx_vm_deserializer_t *, uint32_t, apx_sizeType_t)"
                   );
    }
    self_local._4_4_ = deserializer_prepare_for_buffer_read(self,'\a',4);
    if (self_local._4_4_ == 0) {
      self_local._4_4_ = deserializer_unpack_value(self,array_length,dynamic_size_type);
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_vm_deserializer_unpack_int32(apx_vm_deserializer_t* self, uint32_t array_length, apx_sizeType_t dynamic_size_type)
{
   if (self != NULL)
   {
      assert(self->state != NULL);
      apx_error_t result = deserializer_prepare_for_buffer_read(self, APX_TYPE_CODE_INT32, INT32_SIZE);
      if (result != APX_NO_ERROR)
      {
         return result;
      }
      return deserializer_unpack_value(self, array_length, dynamic_size_type);
   }
   return APX_INVALID_ARGUMENT_ERROR;
}